

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O2

void __thiscall List::draw(List *this)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  Theme *pTVar7;
  ALLEGRO_FONT *pAVar8;
  int iVar9;
  reference pvVar10;
  uint uVar11;
  int iVar12;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined4 local_468;
  undefined4 local_458;
  SaveState state;
  
  pTVar7 = ((this->super_Widget).dialog)->theme;
  al_store_state(&state,0xffff);
  uVar13._0_4_ = (pTVar7->bg).r;
  uVar13._4_4_ = (pTVar7->bg).g;
  uVar14._0_4_ = (pTVar7->bg).b;
  uVar14._4_4_ = (pTVar7->bg).a;
  iVar9 = (*(this->super_Widget)._vptr_Widget[0x10])(this);
  if ((char)iVar9 != '\0') {
    uVar13 = al_map_rgb(0x40,0x40,0x40);
    uVar14 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
  }
  al_draw_filled_rectangle
            ((float)((this->super_Widget).x1 + 1),(float)((this->super_Widget).y1 + 1),
             (float)((this->super_Widget).x2 + -1),(float)((this->super_Widget).y2 + -1),uVar13,
             uVar14);
  al_set_blender(0,1,3);
  iVar9 = al_get_font_line_height(pTVar7->font);
  iVar12 = 0;
  for (uVar11 = 0;
      (ulong)uVar11 <
      (ulong)((long)(this->items).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->items).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5); uVar11 = uVar11 + 1) {
    iVar6 = (this->super_Widget).y1;
    iVar1 = iVar12 + iVar6;
    if (uVar11 == this->selected_item) {
      uVar4._0_4_ = (pTVar7->highlight).r;
      uVar4._4_4_ = (pTVar7->highlight).g;
      uVar5._0_4_ = (pTVar7->highlight).b;
      uVar5._4_4_ = (pTVar7->highlight).a;
      al_draw_filled_rectangle
                ((float)((this->super_Widget).x1 + 1),(float)iVar1,
                 (float)((this->super_Widget).x2 + -1),(float)(iVar6 + iVar9 + -1 + iVar12),uVar4,
                 uVar5);
    }
    pAVar8 = pTVar7->font;
    uVar2 = (pTVar7->fg).r;
    uVar3 = (pTVar7->fg).b;
    iVar6 = (this->super_Widget).x1;
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at(&this->items,(ulong)uVar11);
    al_draw_text(uVar2,uVar3,(float)iVar6,(float)iVar1,pAVar8,0,(pvVar10->_M_dataplus)._M_p);
    iVar12 = iVar12 + iVar9;
  }
  anon_unknown.dwarf_96ed::SaveState::~SaveState(&state);
  return;
}

Assistant:

void List::draw()
{
   const Theme & theme = dialog->get_theme();
   SaveState state;
   ALLEGRO_COLOR bg = theme.bg;

   if (is_disabled()) {
      bg = al_map_rgb(64, 64, 64);
   }

   al_draw_filled_rectangle(x1 + 1, y1 + 1, x2 - 1, y2 - 1, bg);

   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);
   const int font_height = al_get_font_line_height(theme.font);
   for (unsigned i = 0; i < items.size(); i++) {
      int yi = y1 + i * font_height;

      if (i == selected_item) {
         al_draw_filled_rectangle(x1 + 1, yi, x2 - 1, yi + font_height - 1,
            theme.highlight);
      }

      al_draw_text(theme.font, theme.fg, x1, yi, 0, items.at(i).c_str());
   }
}